

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteBinary
          (ZCCCompiler *this,EZCCExprType op,ZCC_Expression **left,ZCC_Expression **right)

{
  ZCC_Expression *pZVar1;
  ZCC_OpProto *pZVar2;
  int route2len;
  int route1len;
  Conversion *route2 [8];
  Conversion *route1 [8];
  
  if (((*left)->Type == &TypeError->super_PType) || ((*right)->Type == &TypeError->super_PType)) {
    pZVar2 = (ZCC_OpProto *)0x0;
  }
  else {
    route2len = 8;
    route1len = route2len;
    pZVar2 = ZCC_OpInfoType::FindBestProto
                       (ZCC_OpInfo + op,(*left)->Type,route1,&route1len,(*right)->Type,route2,
                        &route2len);
    if (pZVar2 != (ZCC_OpProto *)0x0) {
      pZVar1 = *left;
      ApplyConversion(this,pZVar1,route1,route1len);
      *left = pZVar1;
      pZVar1 = *right;
      ApplyConversion(this,pZVar1,route2,route2len);
      *right = pZVar1;
    }
  }
  return pZVar2;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteBinary(EZCCExprType op, ZCC_Expression *&left, ZCC_Expression *&right)
{
	// If either operand is of type 'error', the result is also 'error'
	if (left->Type == TypeError || right->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route1[CONVERSION_ROUTE_SIZE], *route2[CONVERSION_ROUTE_SIZE];
	int route1len = countof(route1), route2len = countof(route2);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(left->Type, route1, route1len, right->Type, route2, route2len);
	if (proto != NULL)
	{
		left = ApplyConversion(left, route1, route1len);
		right = ApplyConversion(right, route2, route2len);
	}
	return proto;
}